

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles2::Functional::anon_unknown_1::UniformCollection::containsSeveralSamplerTypes
          (UniformCollection *this)

{
  _Vector_base<glu::DataType,_std::allocator<glu::DataType>_> local_28;
  
  getSamplerTypes((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_28,this);
  std::_Vector_base<glu::DataType,_std::allocator<glu::DataType>_>::~_Vector_base(&local_28);
  return 4 < (ulong)((long)local_28._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_28._M_impl.super__Vector_impl_data._M_start);
}

Assistant:

bool containsSeveralSamplerTypes (void) const
	{
		return getSamplerTypes().size() > 1;
	}